

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::RleBpEncoder::WriteValue(RleBpEncoder *this,WriteStream *writer,uint32_t *value)

{
  uint32_t uVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = this->bp_block_count;
  if (iVar2 != 0) {
    uVar1 = *value;
    this->bp_block_count = iVar2 + 1;
    this->bp_block[iVar2] = uVar1;
    if (iVar2 + 1 != 0x100) {
      return;
    }
    WriteRun(this,writer);
    return;
  }
  uVar3 = this->rle_count;
  if (uVar3 != 0) {
    uVar1 = this->rle_value;
    if (uVar1 == *value) {
      this->rle_count = uVar3 + 1;
      return;
    }
    if (uVar3 < 4) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        this->bp_block[uVar4] = uVar1;
      }
      uVar1 = *value;
      this->bp_block_count = uVar4 + 1;
      this->bp_block[uVar4] = uVar1;
      this->rle_count = 0;
      return;
    }
    WriteRun(this,writer);
  }
  this->rle_value = *value;
  this->rle_count = 1;
  return;
}

Assistant:

void WriteValue(WriteStream &writer, const uint32_t &value) {
		if (bp_block_count != 0) {
			// We already committed to a BP run
			D_ASSERT(rle_count == 0);
			bp_block[bp_block_count++] = value;
			if (bp_block_count == BP_BLOCK_SIZE) {
				WriteRun(writer);
			}
			return;
		}

		if (rle_count == 0) {
			// Starting fresh, try for an RLE run first
			rle_value = value;
			rle_count = 1;
			return;
		}

		// We're trying for an RLE run
		if (rle_value == value) {
			// Same as current RLE value
			rle_count++;
			return;
		}

		// Value differs from current RLE value
		if (rle_count >= MINIMUM_RLE_COUNT) {
			// We have enough values for an RLE run
			WriteRun(writer);
			rle_value = value;
			rle_count = 1;
			return;
		}

		// Not enough values, convert and commit to a BP run
		D_ASSERT(bp_block_count == 0);
		for (idx_t i = 0; i < rle_count; i++) {
			bp_block[bp_block_count++] = rle_value;
		}
		bp_block[bp_block_count++] = value;
		rle_count = 0;
	}